

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

double __thiscall
duckdb::WindowQuantileState<long>::WindowScalar<double,false>
          (WindowQuantileState<long> *this,CursorType *data,SubFrames *frames,idx_t n,Vector *result
          ,QuantileValue *q)

{
  bool bVar1;
  pointer this_00;
  reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  size_t *psVar5;
  InternalException *this_01;
  QuantileSortTree *in_RDI;
  IndexError *idx_err;
  array<long,_2UL> dest;
  Interpolator<false> interp;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  vector<std::pair<unsigned_long,_long>,_true> *in_stack_fffffffffffffed0;
  QuantileValue *in_stack_fffffffffffffed8;
  allocator *paVar6;
  Interpolator<false> *in_stack_fffffffffffffee0;
  Interpolator<false> *in_stack_fffffffffffffee8;
  HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
  *in_stack_fffffffffffffef0;
  QuantileValue *in_stack_ffffffffffffff18;
  long lVar7;
  Vector *in_stack_ffffffffffffff20;
  idx_t in_stack_ffffffffffffff28;
  SubFrames *in_stack_ffffffffffffff30;
  QuantileCursor<long> *in_stack_ffffffffffffff38;
  allocator local_b1;
  string local_b0 [168];
  double local_8;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
                      *)0xa6fa69);
  if (bVar1) {
    unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>::
    operator->((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
                *)in_stack_fffffffffffffed0);
    local_8 = QuantileSortTree::WindowScalar<long,double,false>
                        (in_RDI,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                         in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                         in_stack_ffffffffffffff18);
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
                        *)0xa6fac5);
    if (!bVar1) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      paVar6 = &local_b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"No accelerator for scalar QUANTILE",paVar6);
      duckdb::InternalException::InternalException(this_01,local_b0);
      __cxa_throw(this_01,&InternalException::typeinfo,InternalException::~InternalException);
    }
    this_00 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>,_true>
              ::operator->((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>,_true>
                            *)in_stack_fffffffffffffed0);
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>::
    size(this_00);
    Interpolator<false>::Interpolator
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(idx_t)in_stack_fffffffffffffed0,
               (bool)in_stack_fffffffffffffecf);
    unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>,_true>
    ::operator->((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>,_true>
                  *)in_stack_fffffffffffffed0);
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>::at
              (in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8,
               (size_t)in_stack_fffffffffffffee0,
               (vector<std::pair<unsigned_long,_long>,_std::allocator<std::pair<unsigned_long,_long>_>_>
                *)in_stack_fffffffffffffed8);
    pvVar2 = vector<std::pair<unsigned_long,_long>,_true>::operator[]
                       (in_stack_fffffffffffffed0,
                        CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    lVar7 = pvVar2->second;
    pvVar3 = std::array<long,_2UL>::operator[]
                       ((array<long,_2UL> *)in_stack_fffffffffffffed0,
                        CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    *pvVar3 = lVar7;
    sVar4 = std::
            vector<std::pair<unsigned_long,_long>,_std::allocator<std::pair<unsigned_long,_long>_>_>
            ::size((vector<std::pair<unsigned_long,_long>,_std::allocator<std::pair<unsigned_long,_long>_>_>
                    *)(in_RDI + 5));
    if (sVar4 < 2) {
      pvVar2 = vector<std::pair<unsigned_long,_long>,_true>::operator[]
                         (in_stack_fffffffffffffed0,
                          CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      in_stack_fffffffffffffee8 = (Interpolator<false> *)pvVar2->second;
      psVar5 = (size_t *)
               std::array<long,_2UL>::operator[]
                         ((array<long,_2UL> *)in_stack_fffffffffffffed0,
                          CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      *psVar5 = (size_t)in_stack_fffffffffffffee8;
    }
    else {
      pvVar2 = vector<std::pair<unsigned_long,_long>,_true>::operator[]
                         (in_stack_fffffffffffffed0,
                          CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      lVar7 = pvVar2->second;
      pvVar3 = std::array<long,_2UL>::operator[]
                         ((array<long,_2UL> *)in_stack_fffffffffffffed0,
                          CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      *pvVar3 = lVar7;
    }
    std::array<long,_2UL>::data((array<long,_2UL> *)0xa6fcca);
    local_8 = Interpolator<false>::Extract<long,double>
                        (in_stack_fffffffffffffee8,(long *)in_stack_fffffffffffffee0,
                         (Vector *)in_stack_fffffffffffffed8);
  }
  return local_8;
}

Assistant:

RESULT_TYPE WindowScalar(CursorType &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) const {
		D_ASSERT(n > 0);
		if (qst) {
			return qst->WindowScalar<INPUT_TYPE, RESULT_TYPE, DISCRETE>(data, frames, n, result, q);
		} else if (s) {
			// Find the position(s) needed
			try {
				Interpolator<DISCRETE> interp(q, s->size(), false);
				s->at(interp.FRN, interp.CRN - interp.FRN + 1, skips);
				array<INPUT_TYPE, 2> dest;
				dest[0] = skips[0].second;
				if (skips.size() > 1) {
					dest[1] = skips[1].second;
				} else {
					// Avoid UMA
					dest[1] = skips[0].second;
				}
				return interp.template Extract<INPUT_TYPE, RESULT_TYPE>(dest.data(), result);
			} catch (const duckdb_skiplistlib::skip_list::IndexError &idx_err) {
				throw InternalException(idx_err.message());
			}
		} else {
			throw InternalException("No accelerator for scalar QUANTILE");
		}
	}